

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall wasm::DataFlow::Printer::printInternal(Printer *this,Node *node)

{
  bool bVar1;
  Const *pCVar2;
  ostream *this_00;
  mapped_type *pmVar3;
  Literal local_30;
  Node *local_18;
  Node *node_local;
  Printer *this_local;
  
  local_18 = node;
  node_local = (Node *)this;
  local_18 = getMaybeReplaced(this,node);
  if (local_18 != (Node *)0x0) {
    bVar1 = Node::isConst(local_18);
    if (bVar1) {
      pCVar2 = Expression::cast<wasm::Const>((local_18->field_1).expr);
      wasm::Literal::Literal(&local_30,&pCVar2->value);
      print(this,&local_30);
      wasm::Literal::~Literal(&local_30);
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"%");
      pmVar3 = std::
               unordered_map<wasm::DataFlow::Node_*,_unsigned_int,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>_>
               ::operator[](&this->indexing,&local_18);
      std::ostream::operator<<(this_00,*pmVar3);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                ,0x20e,"void wasm::DataFlow::Printer::printInternal(Node *)");
}

Assistant:

void printInternal(Node* node) {
    node = getMaybeReplaced(node);
    assert(node);
    if (node->isConst()) {
      print(node->expr->cast<Const>()->value);
    } else {
      std::cout << "%" << indexing[node];
    }
  }